

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O0

int __thiscall
ON_PolylineCurve::GetNurbForm
          (ON_PolylineCurve *this,ON_NurbsCurve *nurb,double tol,ON_Interval *subdomain)

{
  ON_Interval *this_00;
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ON_3dPoint *point;
  ulong uVar5;
  bool local_79;
  ON_Interval local_48;
  int local_34;
  int local_30;
  int i;
  int count;
  int rc;
  ON_Interval *subdomain_local;
  double tol_local;
  ON_NurbsCurve *nurb_local;
  ON_PolylineCurve *this_local;
  
  i = 0;
  _count = subdomain;
  subdomain_local = (ON_Interval *)tol;
  tol_local = (double)nurb;
  nurb_local = (ON_NurbsCurve *)this;
  local_30 = PointCount(this);
  dVar1 = tol_local;
  if (local_30 < 2) {
    ON_NurbsCurve::Destroy((ON_NurbsCurve *)tol_local);
  }
  else {
    iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x18])();
    bVar2 = ON_NurbsCurve::Create((ON_NurbsCurve *)dVar1,iVar3,false,2,local_30);
    if (bVar2) {
      for (local_34 = 0; dVar1 = tol_local, this_00 = _count, iVar3 = local_34, local_34 < local_30;
          local_34 = local_34 + 1) {
        pdVar4 = ON_SimpleArray<double>::operator[](&this->m_t,local_34);
        ON_NurbsCurve::SetKnot((ON_NurbsCurve *)dVar1,iVar3,*pdVar4);
        dVar1 = tol_local;
        iVar3 = local_34;
        point = ON_SimpleArray<ON_3dPoint>::operator[]
                          ((ON_SimpleArray<ON_3dPoint> *)&this->m_pline,local_34);
        ON_NurbsCurve::SetCV((ON_NurbsCurve *)dVar1,iVar3,point);
      }
      local_79 = false;
      if (_count != (ON_Interval *)0x0) {
        (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
        local_79 = ON_Interval::operator!=(this_00,&local_48);
      }
      if (local_79 != false) {
        (**(code **)(*(long *)tol_local + 0x1e0))(tol_local,_count);
      }
      uVar5 = (**(code **)(*(long *)tol_local + 0x30))(tol_local,0);
      if ((uVar5 & 1) != 0) {
        i = 1;
      }
    }
  }
  return i;
}

Assistant:

int ON_PolylineCurve::GetNurbForm( 
                                  ON_NurbsCurve& nurb, 
                                  double tol,
                                  const ON_Interval* subdomain  // OPTIONAL subdomain of ON::ProxyCurve::Domain()
                                  ) const
{
  int rc = 0;
  const int count = PointCount();
  if ( count < 2 )
    nurb.Destroy();
  else  if ( nurb.Create( Dimension(), false, 2, count) ) {
    int i;
    for ( i = 0; i < count; i++ ) {
      nurb.SetKnot( i, m_t[i] );
      nurb.SetCV( i, m_pline[i] );
    }
    if ( subdomain && *subdomain != Domain() )
      nurb.Trim(*subdomain);
    if ( nurb.IsValid() )
      rc = 1;
  }
  return rc;
}